

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordManager.cpp
# Opt level: O0

set<Addr,_std::less<Addr>,_std::allocator<Addr>_> * __thiscall
RecordManager::FindandDelete
          (set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *__return_storage_ptr__,
          RecordManager *this,STMT *S)

{
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> local_f8;
  STMT local_c8;
  STMT local_70;
  undefined1 local_21;
  STMT *local_20;
  STMT *S_local;
  RecordManager *this_local;
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *target;
  
  local_21 = 0;
  local_20 = S;
  S_local = (STMT *)this;
  this_local = (RecordManager *)__return_storage_ptr__;
  STMT::STMT(&local_70,S);
  FindSuchRecord(__return_storage_ptr__,this,&local_70);
  STMT::~STMT(&local_70);
  STMT::STMT(&local_c8,S);
  std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::set(&local_f8,__return_storage_ptr__);
  DeleteSuchRecord(this,&local_c8,&local_f8);
  std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::~set(&local_f8);
  STMT::~STMT(&local_c8);
  return __return_storage_ptr__;
}

Assistant:

set<Addr> RecordManager::FindandDelete(STMT S) {
	set<Addr> target = this->FindSuchRecord(S);
	this->DeleteSuchRecord(S, target);
	return target;
}